

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::WrapKeySym(SoftHSM *this,CK_MECHANISM_PTR pMechanism,Token *token,OSObject *wrapKey,
                   ByteString *keydata,ByteString *wrapped)

{
  long lVar1;
  long *plVar2;
  byte bVar3;
  int iVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  long *plVar6;
  CK_RV CVar7;
  size_t sVar8;
  uchar *__dest;
  long *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  ByteString encryptedFinal;
  ByteString iv;
  SymmetricKey *wrappingkey;
  SymmetricAlgorithm *cipher;
  size_t wrappedlen;
  size_t blocksize;
  size_t bb;
  Type mode;
  Type algo;
  size_t in_stack_fffffffffffffe68;
  ByteString *in_stack_fffffffffffffe70;
  ByteString *in_stack_fffffffffffffe78;
  SoftHSM *in_stack_fffffffffffffe80;
  ByteString *in_stack_fffffffffffffe88;
  undefined7 in_stack_fffffffffffffe90;
  undefined1 in_stack_fffffffffffffe97;
  OSObject *key;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  SymmetricKey *in_stack_ffffffffffffff10;
  SoftHSM *in_stack_ffffffffffffff18;
  undefined1 local_c8 [40];
  undefined1 local_a0 [56];
  long *local_68;
  long *local_60;
  size_t local_58;
  size_t local_50;
  long local_48;
  undefined4 local_40;
  uint local_3c;
  undefined8 local_38;
  undefined8 local_30;
  long *local_18;
  CK_RV local_8;
  
  local_3c = 0;
  local_40 = 0;
  local_48 = 8;
  local_50 = 0;
  local_38 = in_R9;
  local_30 = in_R8;
  local_18 = in_RSI;
  local_58 = ByteString::size((ByteString *)0x187212);
  key = (OSObject *)*local_18;
  if (key == (OSObject *)0x133) {
    local_3c = 3;
  }
  else if (key == (OSObject *)0x136) {
    local_50 = 8;
    local_58 = RFC5652Pad((SoftHSM *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
    local_3c = 3;
  }
  else if (key == (OSObject *)0x1082) {
    local_3c = 1;
  }
  else if (key == (OSObject *)0x1085) {
    local_50 = 0x10;
    local_58 = RFC5652Pad((SoftHSM *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
                          in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
    local_3c = 1;
  }
  else if (key == (OSObject *)0x2109) {
    local_58 = RFC3394Pad(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if ((local_58 < 0x10) || ((local_58 & 7) != 0)) {
      return 0x62;
    }
    local_3c = 1;
    local_40 = 1;
  }
  else {
    if (key != (OSObject *)0x210a) {
      return 0x70;
    }
    local_3c = 1;
    local_40 = 2;
  }
  pCVar5 = CryptoFactory::i();
  iVar4 = (**pCVar5->_vptr_CryptoFactory)(pCVar5,(ulong)local_3c);
  local_60 = (long *)CONCAT44(extraout_var,iVar4);
  if (local_60 == (long *)0x0) {
    return 0x70;
  }
  plVar6 = (long *)operator_new(0x38);
  SymmetricKey::SymmetricKey
            ((SymmetricKey *)in_stack_fffffffffffffe80,(size_t)in_stack_fffffffffffffe78);
  local_68 = plVar6;
  CVar7 = getSymmetricKey(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
                          (Token *)CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),key
                         );
  plVar6 = local_68;
  if (CVar7 != 0) {
    (**(code **)(*local_60 + 0x50))(local_60,local_68);
    pCVar5 = CryptoFactory::i();
    (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
    return 5;
  }
  (**(code **)(*local_68 + 0x20))();
  sVar8 = ByteString::size((ByteString *)0x1874e9);
  (**(code **)(*plVar6 + 0x30))(plVar6,sVar8 * local_48);
  ByteString::ByteString((ByteString *)0x187516);
  ByteString::ByteString((ByteString *)0x187523);
  lVar1 = *local_18;
  if ((((lVar1 == 0x133) || (lVar1 == 0x136)) || (lVar1 == 0x1082)) || (lVar1 == 0x1085)) {
    ByteString::resize(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    __dest = ByteString::operator[](in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    memcpy(__dest,(void *)local_18[1],local_50);
    plVar2 = local_60;
    plVar6 = local_68;
    ByteString::ByteString((ByteString *)0x1875fc);
    bVar3 = (**(code **)(*plVar2 + 0x10))(plVar2,plVar6,1,local_a0,0,0,&stack0xffffffffffffff10,0);
    ByteString::~ByteString((ByteString *)0x187657);
    if (((bVar3 ^ 0xff) & 1) != 0) {
      (**(code **)(*local_60 + 0x50))(local_60,local_68);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
      local_8 = 0x70;
      goto LAB_0018791a;
    }
    bVar3 = (**(code **)(*local_60 + 0x18))(local_60,local_30,local_38);
    if ((bVar3 & 1) == 0) {
      (**(code **)(*local_60 + 0x50))(local_60,local_68);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
      local_8 = 5;
      goto LAB_0018791a;
    }
    bVar3 = (**(code **)(*local_60 + 0x20))(local_60,local_c8);
    if ((bVar3 & 1) == 0) {
      (**(code **)(*local_60 + 0x50))(local_60,local_68);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
      local_8 = 5;
      goto LAB_0018791a;
    }
    ByteString::operator+=
              ((ByteString *)CONCAT17(in_stack_fffffffffffffe97,in_stack_fffffffffffffe90),
               in_stack_fffffffffffffe88);
  }
  else {
    bVar3 = (**(code **)(*local_60 + 0x40))(local_60,local_68,local_40,local_30,local_38);
    if ((bVar3 & 1) == 0) {
      (**(code **)(*local_60 + 0x50))(local_60,local_68);
      pCVar5 = CryptoFactory::i();
      (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
      local_8 = 5;
      goto LAB_0018791a;
    }
  }
  (**(code **)(*local_60 + 0x50))(local_60,local_68);
  pCVar5 = CryptoFactory::i();
  (*pCVar5->_vptr_CryptoFactory[1])(pCVar5,local_60);
  local_8 = 0;
LAB_0018791a:
  ByteString::~ByteString((ByteString *)0x187927);
  ByteString::~ByteString((ByteString *)0x187934);
  return local_8;
}

Assistant:

CK_RV SoftHSM::WrapKeySym
(
	CK_MECHANISM_PTR pMechanism,
	Token* token,
	OSObject* wrapKey,
	ByteString& keydata,
	ByteString& wrapped
)
{
	// Get the symmetric algorithm matching the mechanism
	SymAlgo::Type algo = SymAlgo::Unknown;
	SymWrap::Type mode = SymWrap::Unknown;
	size_t bb = 8;
	size_t blocksize = 0;
	auto wrappedlen = keydata.size();

	switch(pMechanism->mechanism) {
#ifdef HAVE_AES_KEY_WRAP
		case CKM_AES_KEY_WRAP:
			wrappedlen = RFC3394Pad(keydata);
			if ((wrappedlen < 16) || ((wrappedlen % 8) != 0))
				return CKR_KEY_SIZE_RANGE;
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP;
			break;
#endif
#ifdef HAVE_AES_KEY_WRAP_PAD
		case CKM_AES_KEY_WRAP_PAD:
			algo = SymAlgo::AES;
			mode = SymWrap::AES_KEYWRAP_PAD;
			break;
#endif
		case CKM_AES_CBC:
			algo = SymAlgo::AES;
			break;
			
		case CKM_AES_CBC_PAD:
			blocksize = 16;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::AES;
			break;
			
		case CKM_DES3_CBC:
			algo = SymAlgo::DES3;
			break;
			
		case CKM_DES3_CBC_PAD:
			blocksize = 8;
			wrappedlen = RFC5652Pad(keydata, blocksize);
			algo = SymAlgo::DES3;
			break;
			
		default:
			return CKR_MECHANISM_INVALID;
	}
	SymmetricAlgorithm* cipher = CryptoFactory::i()->getSymmetricAlgorithm(algo);
	if (cipher == NULL) return CKR_MECHANISM_INVALID;

	SymmetricKey* wrappingkey = new SymmetricKey();

	if (getSymmetricKey(wrappingkey, token, wrapKey) != CKR_OK)
	{
		cipher->recycleKey(wrappingkey);
		CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
		return CKR_GENERAL_ERROR;
	}

	// adjust key bit length
	wrappingkey->setBitLen(wrappingkey->getKeyBits().size() * bb);

	ByteString iv;
	ByteString encryptedFinal;

	switch(pMechanism->mechanism) {

		case CKM_AES_CBC:
	        case CKM_AES_CBC_PAD:
		case CKM_DES3_CBC:
	        case CKM_DES3_CBC_PAD:
			iv.resize(blocksize);
			memcpy(&iv[0], pMechanism->pParameter, blocksize);
			
			if (!cipher->encryptInit(wrappingkey, SymMode::CBC, iv, false))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_MECHANISM_INVALID;
			}
			if (!cipher->encryptUpdate(keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			// Finalize encryption
			if (!cipher->encryptFinal(encryptedFinal))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
			wrapped += encryptedFinal;
			break;
		default:
			// Wrap the key
			if (!cipher->wrapKey(wrappingkey, mode, keydata, wrapped))
			{
				cipher->recycleKey(wrappingkey);
				CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
				return CKR_GENERAL_ERROR;
			}
	}

	cipher->recycleKey(wrappingkey);
	CryptoFactory::i()->recycleSymmetricAlgorithm(cipher);
	return CKR_OK;
}